

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O1

void __thiscall pobr::imgProcessing::ImgProcessor::loadImg(ImgProcessor *this,string *imgPath)

{
  char cVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78 [3];
  
  cv::imread((string *)local_78,(int)imgPath);
  cv::Mat::operator=(&this->img,(Mat *)local_78);
  cv::Mat::~Mat((Mat *)local_78);
  cVar1 = cv::Mat::empty();
  if (cVar1 != '\0') {
    std::operator+(&local_98,"Could not properly load image \"",imgPath);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_78[0].field_2._0_8_ = *psVar3;
      local_78[0].field_2._8_8_ = plVar2[3];
      local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
    }
    else {
      local_78[0].field_2._0_8_ = *psVar3;
      local_78[0]._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_78[0]._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    pobr::utils::Logger::warning(local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
      operator_delete(local_78[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

const void
ImgProcessor::loadImg(const std::string& imgPath)
{
    this->img = cv::imread(imgPath);

    if (this->img.empty()) {
        Logger::warning("Could not properly load image \"" + imgPath + "\"...");
    }
}